

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O1

int Abc_NodeIsTravIdCurrent(Abc_Obj_t *p)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  size_t __size;
  int iVar5;
  int iVar6;
  
  pAVar3 = p->pNtk;
  uVar1 = p->Id;
  if ((int)uVar1 < (pAVar3->vTravIds).nSize) goto LAB_00871937;
  iVar2 = (pAVar3->vTravIds).nCap;
  iVar6 = iVar2 * 2;
  iVar5 = (int)((long)(int)uVar1 + 1);
  if ((int)uVar1 < iVar6) {
    if (iVar2 < iVar6 && iVar2 <= (int)uVar1) {
      piVar4 = (pAVar3->vTravIds).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar2 << 3);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)iVar2 << 3);
      }
      (pAVar3->vTravIds).pArray = piVar4;
LAB_008718f2:
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar6;
    }
  }
  else if (iVar2 <= (int)uVar1) {
    piVar4 = (pAVar3->vTravIds).pArray;
    __size = ((long)(int)uVar1 + 1) * 4;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(__size);
    }
    else {
      piVar4 = (int *)realloc(piVar4,__size);
    }
    (pAVar3->vTravIds).pArray = piVar4;
    iVar6 = iVar5;
    goto LAB_008718f2;
  }
  iVar2 = (pAVar3->vTravIds).nSize;
  if (iVar2 <= (int)uVar1) {
    memset((pAVar3->vTravIds).pArray + iVar2,0,(ulong)(uVar1 - iVar2) * 4 + 4);
  }
  (pAVar3->vTravIds).nSize = iVar5;
LAB_00871937:
  if ((-1 < (int)uVar1) && ((int)uVar1 < (pAVar3->vTravIds).nSize)) {
    return (int)((pAVar3->vTravIds).pArray[uVar1] == p->pNtk->nTravIds);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int         Abc_NodeIsTravIdCurrent( Abc_Obj_t * p )          { return (Abc_NodeTravId(p) == Abc_ObjNtk(p)->nTravIds);                                }